

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

int __thiscall
mpt::message_store::entry::set(entry *this,char *from,int type,char *fmt,__va_list_tag *arg)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  size_t sVar4;
  size_t local_50;
  size_t len;
  array d;
  header *h;
  __va_list_tag *arg_local;
  char *fmt_local;
  int type_local;
  char *from_local;
  entry *this_local;
  
  array::array((array *)&len,0);
  d._buf._ref = (reference<mpt::array::content>)array::append((array *)&len,4,(void *)0x0);
  if (d._buf._ref == (content *)0x0) {
    this_local._4_4_ = -1;
    goto LAB_00148340;
  }
  *(content *)((long)d._buf._ref + 1) = (content)0x0;
  *(content *)d._buf._ref = (content)0x0;
  *(content *)((long)d._buf._ref + 3) = SUB41(type,0);
  *(content *)((long)d._buf._ref + 2) = (content)0x0;
  if (from == (char *)0x0) {
    local_50._0_1_ = (content)0x0;
  }
  else {
    sVar2 = strlen(from);
    if (sVar2 < 0xff) {
      local_50 = sVar2 + 1;
      pvVar3 = array::append((array *)&len,local_50,from);
      if (pvVar3 == (void *)0x0) {
        this_local._4_4_ = -1;
        goto LAB_00148340;
      }
    }
    else {
      pvVar3 = array::append((array *)&len,0xff,from);
      if ((pvVar3 == (void *)0x0) ||
         (pvVar3 = array::append((array *)&len,1,""), pvVar3 == (void *)0x0)) {
        this_local._4_4_ = -1;
        goto LAB_00148340;
      }
      local_50 = 0xff;
    }
  }
  d._buf._ref = (reference<mpt::array::content>)array::base((array *)&len);
  *(content *)d._buf._ref = local_50._0_1_;
  if (fmt == (char *)0x0) {
    *(content *)((long)d._buf._ref + 1) = (content)0x0;
  }
  else {
    iVar1 = mpt_vprintf(&len,fmt,arg);
    if (iVar1 < 0) {
      this_local._4_4_ = -1;
      goto LAB_00148340;
    }
    d._buf._ref = (reference<mpt::array::content>)array::base((array *)&len);
    *(content *)((long)d._buf._ref + 1) = (content)0x1;
  }
  mpt_array_clone(this,&len);
  sVar4 = array::length(&this->super_array);
  this_local._4_4_ = (int)sVar4;
LAB_00148340:
  array::~array((array *)&len);
  return this_local._4_4_;
}

Assistant:

int message_store::entry::set(const char *from, int type, const char *fmt, va_list arg)
{
	header *h;
	array d;
	size_t len;
	
	if (!(h = static_cast<header *>(d.append(sizeof(*h))))) {
		return -1;
	}
	h->args = 0;
	h->from = 0;
	h->type = type;
	h->_cmd = 0;
	
	static const size_t maxlen = std::numeric_limits<__decltype(h->from)>::max();
	if (!from) {
		len = 0;
	}
	else if ((len = strlen(from)) >= maxlen) {
		static const char end = 0;
		if (!(d.append(maxlen, from)) || !(d.append(1, &end))) {
			return -1;
		}
		len = maxlen;
	} else {
		if (!(d.append(++len, from))) {
			return -1;
		}
	}
	h = static_cast<header *>(d.base());
	h->from = len;
	
	if (!fmt) {
		h->args = 0;
	}
	else if (mpt_vprintf(&d, fmt, arg) < 0) {
		return -1;
	} else {
		h = static_cast<header *>(d.base());
		h->args = 1;
	}
	
	mpt_array_clone(this, &d);
	
	return length();
}